

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menuinput.cpp
# Opt level: O0

bool __thiscall DTextEnterMenu::MenuEvent(DTextEnterMenu *this,int key,bool fromcontroller)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  DMenu *pDVar4;
  uint uVar5;
  DMenu *parent;
  int ch;
  bool fromcontroller_local;
  int key_local;
  DTextEnterMenu *this_local;
  
  if (key == 7) {
    pDVar4 = TObjPtr<DMenu>::operator->(&(this->super_DMenu).mParentMenu);
    (*(pDVar4->super_DObject)._vptr_DObject[8])(pDVar4,0xb,0);
    bVar2 = DMenu::MenuEvent(&this->super_DMenu,7,fromcontroller);
    return bVar2;
  }
  if (fromcontroller) {
    this->mInputGridOkay = true;
  }
  if ((this->mInputGridOkay & 1U) == 0) {
LAB_003d09a5:
    this_local._7_1_ = false;
  }
  else {
    if ((this->InputGridX == -1) || (this->InputGridY == -1)) {
      this->InputGridY = 0;
      this->InputGridX = 0;
    }
    switch(key) {
    case 0:
      this->InputGridY = (this->InputGridY + 4) % 5;
      this_local._7_1_ = true;
      break;
    case 1:
      this->InputGridY = (this->InputGridY + 1) % 5;
      this_local._7_1_ = true;
      break;
    case 2:
      this->InputGridX = (this->InputGridX + 0xc) % 0xd;
      this_local._7_1_ = true;
      break;
    case 3:
      this->InputGridX = (this->InputGridX + 1) % 0xd;
      this_local._7_1_ = true;
      break;
    default:
      goto LAB_003d09a5;
    case 6:
      bVar2 = false;
      if ((uint)this->InputGridX < 0xd) {
        bVar2 = (uint)this->InputGridY < 5;
      }
      if (!bVar2) {
        __assert_fail("unsigned(InputGridX) < INPUTGRID_WIDTH && unsigned(InputGridY) < INPUTGRID_HEIGHT"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/menu/menuinput.cpp"
                      ,0xff,"virtual bool DTextEnterMenu::MenuEvent(int, bool)");
      }
      if ((this->mInputGridOkay & 1U) != 0) {
        cVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789+-=.,!?@\'\":;[]()<>^#$%&*/_ \b"
                [this->InputGridX + this->InputGridY * 0xd];
        if (cVar1 == '\0') {
          if (*this->mEnterString != '\0') {
            pDVar4 = ::TObjPtr::operator_cast_to_DMenu_((TObjPtr *)&(this->super_DMenu).mParentMenu)
            ;
            (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
            (*(pDVar4->super_DObject)._vptr_DObject[8])(pDVar4,10,0);
            return true;
          }
        }
        else if (cVar1 == '\b') {
          if (this->mEnterPos != 0) {
            uVar5 = this->mEnterPos - 1;
            this->mEnterPos = uVar5;
            this->mEnterString[uVar5] = '\0';
          }
        }
        else if ((this->mEnterPos < this->mEnterSize) &&
                ((this->mSizeMode == 2 ||
                 (iVar3 = FFont::StringWidth(SmallFont,this->mEnterString),
                 (ulong)(long)iVar3 < (ulong)((this->mEnterSize - 1) * 8))))) {
          this->mEnterString[this->mEnterPos] = cVar1;
          uVar5 = this->mEnterPos + 1;
          this->mEnterPos = uVar5;
          this->mEnterString[uVar5] = '\0';
        }
      }
      this_local._7_1_ = true;
      break;
    case 8:
      if (this->mEnterPos != 0) {
        uVar5 = this->mEnterPos - 1;
        this->mEnterPos = uVar5;
        this->mEnterString[uVar5] = '\0';
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DTextEnterMenu::MenuEvent (int key, bool fromcontroller)
{
	if (key == MKEY_Back)
	{
		mParentMenu->MenuEvent(MKEY_Abort, false);
		return Super::MenuEvent(key, fromcontroller);
	}
	if (fromcontroller)
	{
		mInputGridOkay = true;
	}

	if (mInputGridOkay)
	{
		int ch;

		if (InputGridX == -1 || InputGridY == -1)
		{
			InputGridX = InputGridY = 0;
		}
		switch (key)
		{
		case MKEY_Down:
			InputGridY = (InputGridY + 1) % INPUTGRID_HEIGHT;
			return true;

		case MKEY_Up:
			InputGridY = (InputGridY + INPUTGRID_HEIGHT - 1) % INPUTGRID_HEIGHT;
			return true;

		case MKEY_Right:
			InputGridX = (InputGridX + 1) % INPUTGRID_WIDTH;
			return true;

		case MKEY_Left:
			InputGridX = (InputGridX + INPUTGRID_WIDTH - 1) % INPUTGRID_WIDTH;
			return true;

		case MKEY_Clear:
			if (mEnterPos > 0)
			{
				mEnterString[--mEnterPos] = 0;
			}
			return true;

		case MKEY_Enter:
			assert(unsigned(InputGridX) < INPUTGRID_WIDTH && unsigned(InputGridY) < INPUTGRID_HEIGHT);
			if (mInputGridOkay)
			{
				ch = InputGridChars[InputGridX + InputGridY * INPUTGRID_WIDTH];
				if (ch == 0)			// end
				{
					if (mEnterString[0] != '\0')
					{
						DMenu *parent = mParentMenu;
						Close();
						parent->MenuEvent(MKEY_Input, false);
						return true;
					}
				}
				else if (ch == '\b')	// bs
				{
					if (mEnterPos > 0)
					{
						mEnterString[--mEnterPos] = 0;
					}
				}
				else if (mEnterPos < mEnterSize &&
					(mSizeMode == 2/*entering player name*/ || (size_t)SmallFont->StringWidth(mEnterString) < (mEnterSize-1)*8))
				{
					mEnterString[mEnterPos] = ch;
					mEnterString[++mEnterPos] = 0;
				}
			}
			return true;

		default:
			break;	// Keep GCC quiet
		}
	}
	return false;
}